

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmTargetPropertyComputer.cxx
# Opt level: O2

bool cmTargetPropertyComputer::WhiteListedInterfaceProperty(string *prop)

{
  bool bVar1;
  bool bVar2;
  int iVar3;
  size_type sVar4;
  long lVar5;
  undefined1 local_1d8;
  undefined1 local_1d7;
  undefined1 local_1d6;
  allocator<char> local_1d5;
  allocator<char> local_1d4;
  allocator<char> local_1d3;
  allocator<char> local_1d2;
  allocator<char> local_1d1;
  allocator<char> local_1d0;
  allocator<char> local_1cf;
  allocator<char> local_1ce;
  allocator<char> local_1cd;
  allocator<char> local_1cc;
  allocator<char> local_1cb;
  allocator<char> local_1ca;
  allocator<char> local_1c9;
  string local_1c8 [32];
  string local_1a8 [32];
  string local_188 [32];
  string local_168 [32];
  string local_148 [32];
  string local_128 [32];
  string local_108 [32];
  string local_e8 [32];
  string local_c8 [32];
  string local_a8 [32];
  string local_88 [32];
  string local_68 [32];
  string local_48 [32];
  
  bVar1 = cmHasLiteralPrefix<std::__cxx11::string,11ul>(prop,(char (*) [11])0x4cbf6b);
  bVar2 = true;
  if (!bVar1) {
    bVar1 = cmHasLiteralPrefix<std::__cxx11::string,2ul>(prop,(char (*) [2])0x4e0943);
    if (!bVar1) {
      iVar3 = islower((int)*(prop->_M_dataplus)._M_p);
      if (iVar3 == 0) {
        if (WhiteListedInterfaceProperty(std::__cxx11::string_const&)::builtIns_abi_cxx11_ == '\0')
        {
          iVar3 = __cxa_guard_acquire(&WhiteListedInterfaceProperty(std::__cxx11::string_const&)::
                                       builtIns_abi_cxx11_);
          if (iVar3 != 0) {
            std::__cxx11::string::string<std::allocator<char>>
                      (local_1c8,"COMPATIBLE_INTERFACE_BOOL",&local_1c9);
            std::__cxx11::string::string<std::allocator<char>>
                      (local_1a8,"COMPATIBLE_INTERFACE_NUMBER_MAX",&local_1ca);
            std::__cxx11::string::string<std::allocator<char>>
                      (local_188,"COMPATIBLE_INTERFACE_NUMBER_MIN",&local_1cb);
            std::__cxx11::string::string<std::allocator<char>>
                      (local_168,"COMPATIBLE_INTERFACE_STRING",&local_1cc);
            std::__cxx11::string::string<std::allocator<char>>(local_148,"EXPORT_NAME",&local_1cd);
            std::__cxx11::string::string<std::allocator<char>>
                      (local_128,"EXPORT_PROPERTIES",&local_1ce);
            std::__cxx11::string::string<std::allocator<char>>(local_108,"IMPORTED",&local_1cf);
            std::__cxx11::string::string<std::allocator<char>>
                      (local_e8,"IMPORTED_GLOBAL",&local_1d0);
            std::__cxx11::string::string<std::allocator<char>>
                      (local_c8,"MANUALLY_ADDED_DEPENDENCIES",&local_1d1);
            std::__cxx11::string::string<std::allocator<char>>(local_a8,"NAME",&local_1d2);
            std::__cxx11::string::string<std::allocator<char>>(local_88,"PRIVATE_HEADER",&local_1d3)
            ;
            std::__cxx11::string::string<std::allocator<char>>(local_68,"PUBLIC_HEADER",&local_1d4);
            std::__cxx11::string::string<std::allocator<char>>(local_48,"TYPE",&local_1d5);
            std::
            _Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
            ::_Hashtable<std::__cxx11::string_const*>
                      ((_Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                        *)&WhiteListedInterfaceProperty(std::__cxx11::string_const&)::
                           builtIns_abi_cxx11_,local_1c8,&stack0xffffffffffffffd8,0,&local_1d6,
                       &local_1d7,&local_1d8);
            lVar5 = 0x180;
            do {
              std::__cxx11::string::~string(local_1c8 + lVar5);
              lVar5 = lVar5 + -0x20;
            } while (lVar5 != -0x20);
            __cxa_atexit(std::
                         unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ::~unordered_set,
                         &WhiteListedInterfaceProperty(std::__cxx11::string_const&)::
                          builtIns_abi_cxx11_,&__dso_handle);
            __cxa_guard_release(&WhiteListedInterfaceProperty(std::__cxx11::string_const&)::
                                 builtIns_abi_cxx11_);
          }
        }
        sVar4 = std::
                _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                ::count(&WhiteListedInterfaceProperty(std::__cxx11::string_const&)::
                         builtIns_abi_cxx11_._M_h,prop);
        if (sVar4 == 0) {
          bVar1 = std::operator==(prop,"IMPORTED_CONFIGURATIONS");
          if (!bVar1) {
            bVar1 = std::operator==(prop,"IMPORTED_LIBNAME");
            if (!bVar1) {
              bVar1 = cmHasLiteralPrefix<std::__cxx11::string,18ul>
                                (prop,(char (*) [18])"IMPORTED_LIBNAME_");
              if (!bVar1) {
                bVar1 = cmHasLiteralPrefix<std::__cxx11::string,21ul>
                                  (prop,(char (*) [21])"MAP_IMPORTED_CONFIG_");
                if (!bVar1) {
                  bVar2 = std::operator==(prop,"NO_SYSTEM_FROM_IMPORTED");
                }
              }
            }
          }
        }
      }
    }
  }
  return bVar2;
}

Assistant:

bool cmTargetPropertyComputer::WhiteListedInterfaceProperty(
  const std::string& prop)
{
  if (cmHasLiteralPrefix(prop, "INTERFACE_")) {
    return true;
  }
  if (cmHasLiteralPrefix(prop, "_")) {
    return true;
  }
  if (std::islower(prop[0])) {
    return true;
  }
  static std::unordered_set<std::string> const builtIns{
    "COMPATIBLE_INTERFACE_BOOL",
    "COMPATIBLE_INTERFACE_NUMBER_MAX",
    "COMPATIBLE_INTERFACE_NUMBER_MIN",
    "COMPATIBLE_INTERFACE_STRING",
    "EXPORT_NAME",
    "EXPORT_PROPERTIES",
    "IMPORTED",
    "IMPORTED_GLOBAL",
    "MANUALLY_ADDED_DEPENDENCIES",
    "NAME",
    "PRIVATE_HEADER",
    "PUBLIC_HEADER",
    "TYPE"
  };

  if (builtIns.count(prop)) {
    return true;
  }

  if (prop == "IMPORTED_CONFIGURATIONS" || prop == "IMPORTED_LIBNAME" ||
      cmHasLiteralPrefix(prop, "IMPORTED_LIBNAME_") ||
      cmHasLiteralPrefix(prop, "MAP_IMPORTED_CONFIG_")) {
    return true;
  }

  // This property should not be allowed but was incorrectly added in
  // CMake 3.8.  We can't remove it from the whitelist without breaking
  // projects that try to set it.  One day we could warn about this, but
  // for now silently accept it.
  if (prop == "NO_SYSTEM_FROM_IMPORTED") {
    return true;
  }

  return false;
}